

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void quantize(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  size_type sVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string *in_stack_00000008;
  FastText *in_stack_00000010;
  FastText fasttext;
  Args a;
  Args *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  FastText *in_stack_fffffffffffffdb0;
  Args *in_stack_fffffffffffffdd0;
  Args *in_stack_fffffffffffffed8;
  FastText *in_stack_fffffffffffffee0;
  string *in_stack_ffffffffffffffc8;
  FastText *in_stack_ffffffffffffffd0;
  
  ::fasttext::Args::Args(in_stack_fffffffffffffdd0);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if (sVar1 < 3) {
    printQuantizeUsage();
    ::fasttext::Args::printHelp(in_stack_fffffffffffffd80);
    exit(1);
  }
  ::fasttext::Args::parseArgs
            ((Args *)a._192_8_,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)a.t);
  ::fasttext::FastText::FastText(in_stack_fffffffffffffdb0);
  std::operator+(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  ::fasttext::FastText::loadModel(in_stack_00000010,in_stack_00000008);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffda0);
  ::fasttext::FastText::quantize(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::operator+(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  ::fasttext::FastText::saveModel(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd80);
  exit(0);
}

Assistant:

void quantize(const std::vector<std::string>& args) {
  Args a = Args();
  if (args.size() < 3) {
    printQuantizeUsage();
    a.printHelp();
    exit(EXIT_FAILURE);
  }
  a.parseArgs(args);
  FastText fasttext;
  // parseArgs checks if a->output is given.
  fasttext.loadModel(a.output + ".bin");
  fasttext.quantize(a);
  fasttext.saveModel(a.output + ".ftz");
  exit(0);
}